

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int sumy;
  int iVar6;
  Student *pSVar7;
  size_t sVar8;
  ostream *poVar9;
  Student *pSVar10;
  int sumx;
  int iVar11;
  int i;
  long lVar12;
  int sumx_1;
  int sumx_2;
  int j;
  long lVar13;
  long lVar14;
  Student *pSVar15;
  int n;
  value_type __val;
  int local_9c;
  int local_98 [4];
  undefined8 local_88;
  undefined8 uStack_80;
  int local_78 [4];
  int local_68 [4];
  int local_58 [4];
  int local_48 [6];
  
  __isoc99_scanf("%d");
  if (0 < local_9c) {
    lVar14 = 0;
    do {
      __isoc99_scanf("%s",stu + lVar14);
      lVar12 = 0;
      do {
        __isoc99_scanf("%d");
        lVar12 = lVar12 + 4;
      } while (lVar12 != 0x10);
      lVar14 = lVar14 + 1;
    } while (lVar14 < local_9c);
  }
  lVar14 = 0x104090;
  pSVar10 = stu + 1;
  pSVar15 = stu;
  do {
    pSVar7 = pSVar10;
    local_88 = *(undefined8 *)pSVar7->socre;
    uStack_80 = *(undefined8 *)(pSVar7->socre + 2);
    local_78._0_8_ = stu[0].name._0_8_;
    local_78._8_8_ = stu[0]._8_8_;
    local_68[0] = stu[0].socre[0];
    local_68[1] = stu[0].socre[1];
    local_68[2] = stu[0].socre[2];
    local_68[3] = stu[0].socre[3];
    iVar6 = 0;
    lVar12 = 4;
    iVar11 = 0;
    do {
      iVar11 = iVar11 + local_98[lVar12];
      iVar6 = iVar6 + local_78[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 8);
    if (iVar6 < iVar11) {
      local_98._0_8_ = *(undefined8 *)pSVar7->name;
      local_98._8_8_ = *(undefined8 *)(pSVar7->name + 8);
      local_88 = *(undefined8 *)pSVar7->socre;
      uStack_80 = *(undefined8 *)(pSVar7->socre + 2);
      memmove((void *)((long)pSVar15 + (0x40 - (long)(pSVar7 + -0x8204))),stu,
              (size_t)(pSVar7 + -0x8204));
      stu[0].name._0_8_ = local_98._0_8_;
      stu[0]._8_8_ = local_98._8_8_;
      stu[0].socre[0] = (int)local_88;
      stu[0].socre[1] = local_88._4_4_;
      stu[0].socre[2] = (int)uStack_80;
      stu[0].socre[3] = uStack_80._4_4_;
    }
    else {
      local_58._0_8_ = *(undefined8 *)pSVar7->name;
      local_58._8_8_ = *(undefined8 *)(pSVar7->name + 8);
      uVar1 = *(undefined8 *)pSVar7->socre;
      uVar2 = *(undefined8 *)(pSVar7->socre + 2);
      local_48[0] = (int)uVar1;
      local_48[1] = SUB84(uVar1,4);
      local_48[2] = (int)uVar2;
      local_48[3] = SUB84(uVar2,4);
      local_88 = *(undefined8 *)pSVar7->socre;
      uStack_80 = *(undefined8 *)(pSVar7->socre + 2);
      local_78._0_8_ = *(undefined8 *)pSVar7[-1].name;
      local_78._8_8_ = *(undefined8 *)(pSVar7[-1].name + 8);
      local_68._0_8_ = *(undefined8 *)pSVar7[-1].socre;
      local_68._8_8_ = *(undefined8 *)(pSVar7[-1].socre + 2);
      iVar6 = 0;
      lVar12 = 4;
      iVar11 = 0;
      do {
        iVar11 = iVar11 + local_98[lVar12];
        iVar6 = iVar6 + local_78[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 8);
      pSVar10 = pSVar7;
      pSVar15 = pSVar7;
      local_98._0_8_ = *(undefined8 *)pSVar7->name;
      local_98._8_8_ = *(undefined8 *)(pSVar7->name + 8);
      if (iVar6 < iVar11) {
        do {
          pSVar10 = pSVar15 + -1;
          uVar3 = *(undefined8 *)pSVar10->name;
          uVar4 = *(undefined8 *)(pSVar15[-1].name + 8);
          uVar5 = *(undefined8 *)(pSVar15[-1].socre + 2);
          *(undefined8 *)pSVar15->socre = *(undefined8 *)pSVar15[-1].socre;
          *(undefined8 *)(pSVar15->socre + 2) = uVar5;
          *(undefined8 *)pSVar15->name = uVar3;
          *(undefined8 *)(pSVar15->name + 8) = uVar4;
          local_88._0_4_ = (int)uVar1;
          local_88._4_4_ = SUB84(uVar1,4);
          uStack_80._0_4_ = (int)uVar2;
          uStack_80._4_4_ = SUB84(uVar2,4);
          local_78._0_8_ = *(undefined8 *)pSVar15[-2].name;
          local_78._8_8_ = *(undefined8 *)(pSVar15[-2].name + 8);
          local_68._0_8_ = *(undefined8 *)pSVar15[-2].socre;
          local_68._8_8_ = *(undefined8 *)(pSVar15[-2].socre + 2);
          iVar6 = 0;
          lVar12 = 4;
          iVar11 = 0;
          do {
            iVar11 = iVar11 + local_58[lVar12];
            iVar6 = iVar6 + local_78[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar12 != 8);
          pSVar15 = pSVar10;
          local_98._0_8_ = local_58._0_8_;
          local_98._8_8_ = local_58._8_8_;
        } while (iVar6 < iVar11);
      }
      *(undefined8 *)pSVar10->socre = uVar1;
      *(undefined8 *)(pSVar10->socre + 2) = uVar2;
      *(undefined8 *)pSVar10->name = local_58._0_8_;
      *(undefined8 *)(pSVar10->name + 8) = local_58._8_8_;
    }
    pSVar10 = pSVar7 + 1;
    pSVar15 = pSVar7;
  } while (pSVar7 + 1 != stu + 5);
  lVar12 = 0;
  do {
    sVar8 = strlen(stu[lVar12].name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,stu[lVar12].name,sVar8)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    lVar13 = 0;
    do {
      poVar9 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,*(int *)(lVar14 + lVar13 * 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    lVar12 = lVar12 + 1;
    lVar14 = lVar14 + 0x20;
  } while (lVar12 != 4);
  return 0;
}

Assistant:

int main() {
    int n;
    scanf("%d",&n);
    for (int i = 0; i < n; ++i) {
    scanf("%s",&stu[i].name);
        for (int j = 0; j < 4; ++j) {
            scanf("%d", &stu[i].socre[j]);
        }
    }
    sort(stu,stu+(4+1),cmp);    //尾地址要往后面走一位,因为地址0-4，一共有5个，所有尾地址填 5。
    for (int i = 0; i < 4; ++i) {
        cout << stu[i].name << " ";
        for (int j = 0; j < 4; ++j) {
            cout << stu[i].socre[j] << " ";
        }
        cout << "\n";
    }
    return 0;
}